

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

char * ktxSupercompressionSchemeString(ktxSupercmpScheme scheme)

{
  char *pcVar1;
  
  if (scheme < 4) {
    return &DAT_00278e78 + *(int *)(&DAT_00278e78 + (ulong)scheme * 4);
  }
  pcVar1 = "Invalid scheme value";
  if ((scheme & 0xffff0000) == KTX_SS_BEGIN_VENDOR_RANGE) {
    pcVar1 = "Vendor or reserved scheme";
  }
  return pcVar1;
}

Assistant:

const char *
ktxSupercompressionSchemeString(ktxSupercmpScheme scheme)
{
    switch (scheme) {
      case KTX_SS_NONE: return "KTX_SS_NONE";
      case KTX_SS_BASIS_LZ: return "KTX_SS_BASIS_LZ";
      case KTX_SS_ZSTD: return "KTX_SS_ZSTD";
      case KTX_SS_ZLIB: return "KTX_SS_ZLIB";
      default:
        if (scheme < KTX_SS_BEGIN_VENDOR_RANGE
            || scheme >= KTX_SS_BEGIN_RESERVED)
            return "Invalid scheme value";
        else
            return "Vendor or reserved scheme";
    }
}